

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O1

compile_errcode __thiscall VariableDefinition::Generate(VariableDefinition *this)

{
  int iVar1;
  bool bVar2;
  SymbolName SVar3;
  compile_errcode unaff_EBP;
  undefined4 uVar4;
  string local_50;
  
  uVar4 = 0;
  do {
    SVar3 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(uVar4) {
    case 0:
      if ((SVar3 & ~SWITCH_SYM) != INT_SYM) {
        unaff_EBP = -1;
        uVar4 = 0;
        goto LAB_0014b018;
      }
      this->m_type = SVar3;
LAB_0014af8f:
      uVar4 = 1;
      break;
    case 1:
      if (SVar3 != IDENTIFIER_SYM) {
        unaff_EBP = -1;
        uVar4 = 1;
        goto LAB_0014b018;
      }
      c0_compile::SymbolValue::GetValue<std::__cxx11::string>
                (&local_50,
                 &(handle_correct_queue->m_symbol_queue).
                  super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.
                  super__Vector_impl_data._M_start[handle_correct_queue->m_current_locate].m_value);
      std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      bVar2 = SymbolTableTree::FindTerm(symbol_table_tree,&this->m_identifier_name,true);
      if (bVar2) {
        this->m_valid = false;
      }
      else {
        this->m_valid = true;
      }
      uVar4 = 2;
      break;
    case 2:
      if (SVar3 == L_SQUARE_BRACKET_SYM) {
        uVar4 = 0xb;
      }
      else {
        if (SVar3 != SEMICOLON_SYM) {
          if (SVar3 == COMMA_SYM) goto LAB_0014af8f;
          unaff_EBP = -1;
          uVar4 = 2;
          goto LAB_0014b018;
        }
LAB_0014afc2:
        uVar4 = 3;
      }
      break;
    case 3:
      unaff_EBP = 0;
      goto LAB_0014b018;
    case 0xb:
      if (SVar3 != INTERGER_SYM) {
        unaff_EBP = -1;
        uVar4 = 0xb;
        goto LAB_0014b018;
      }
      iVar1 = (handle_correct_queue->m_symbol_queue).
              super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
              _M_start[handle_correct_queue->m_current_locate].m_value.value.int_value;
      this->m_array_length = iVar1;
      uVar4 = 0xc;
      if (iVar1 < 1) {
        this->m_valid = false;
      }
      break;
    case 0xc:
      uVar4 = 0xd;
      if (SVar3 != R_SQUARE_BRACKET_SYM) {
        unaff_EBP = -1;
        uVar4 = 0xc;
        goto LAB_0014b018;
      }
      break;
    case 0xd:
      if (SVar3 == COMMA_SYM) goto LAB_0014af8f;
      if (SVar3 == SEMICOLON_SYM) goto LAB_0014afc2;
      unaff_EBP = -1;
      uVar4 = 0xd;
LAB_0014b018:
      bVar2 = false;
      goto LAB_0014b01a;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
    bVar2 = true;
LAB_0014b01a:
    if (!bVar2) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

compile_errcode VariableDefinition::Generate() {
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (IsValidVariableType(name)) {
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    state = 2;
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, true)) {
                        m_valid = false;
                    } else {
                        m_valid = true;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == L_SQUARE_BRACKET_SYM) {
                    state = 11;
                    break;
                } else if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: return COMPILE_OK;
            case 11: {
                if (name == INTERGER_SYM) {
                    state = 12;
                    m_array_length = handle_correct_queue->GetCurrentValue<int>();
                    if (m_array_length <= 0) {
                        m_valid = false;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 12: {
                if (name == R_SQUARE_BRACKET_SYM) {
                    state = 13;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 13: {
                if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}